

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actor.h
# Opt level: O0

DAngle __thiscall
AActor::AngleTo(AActor *this,AActor *other,double oxofs,double oyofs,bool absolute)

{
  byte in_CL;
  undefined7 in_register_00000011;
  TAngle<double> TVar1;
  TVector2<double> local_a8;
  DVector3 local_98;
  TVector2<double> local_80;
  TVector2<double> local_70;
  DVector3 local_60;
  undefined1 local_48 [8];
  DVector2 otherpos;
  bool absolute_local;
  double oyofs_local;
  double oxofs_local;
  AActor *other_local;
  AActor *this_local;
  
  otherpos.Y._7_1_ = in_CL & 1;
  if (otherpos.Y._7_1_ == 0) {
    PosRelative(&local_60,(AActor *)CONCAT71(in_register_00000011,absolute),other);
  }
  else {
    Pos(&local_60,(AActor *)CONCAT71(in_register_00000011,absolute));
  }
  TVector2<double>::TVector2((TVector2<double> *)local_48,&local_60);
  Pos(&local_98,other);
  operator-(&local_80,(TVector3<double> *)local_48);
  TVector2<double>::TVector2(&local_a8,oxofs,oyofs);
  TVector2<double>::operator+(&local_70,&local_80);
  TVar1 = VecToAngle<double>((TVector2<double> *)this);
  return (DAngle)TVar1.Degrees;
}

Assistant:

DAngle AngleTo(AActor *other, double oxofs, double oyofs, bool absolute = false) const
	{
		DVector2 otherpos = absolute ? other->Pos() : other->PosRelative(this);
		return VecToAngle(otherpos - Pos() + DVector2(oxofs, oyofs));
	}